

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O1

Variant * Jinx::Impl::AllAreFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  int iVar1;
  Script *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  char cVar3;
  _Rb_tree_node_base *p_Var4;
  bool value;
  CollectionPtr collPtr;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  bool bVar5;
  
  Variant::GetCollection((Variant *)&stack0xffffffffffffffc0);
  bVar5 = true;
  value = true;
  for (p_Var4 = (((element_type *)local_40)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar2 = (_Rb_tree_header *)p_Var4 ==
              &(((element_type *)local_40)->_M_t)._M_impl.super__Rb_tree_header, !bVar2;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    iVar1 = *(int *)&p_Var4[2]._M_parent;
    if (iVar1 == 8) {
      Variant::GetCoroutine((Variant *)&local_50);
      cVar3 = (**(code **)*local_50)();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
      }
      value = bVar5;
      if (cVar3 == '\0') {
        value = false;
        bVar5 = value;
      }
    }
    else {
      this = (Script *)
             (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (script->super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      Script::Error(this,"Invalid parameters to \'all (of) {} (are) finished\' function");
      __return_storage_ptr__->m_type = Null;
      Variant::SetBoolean(__return_storage_ptr__,false);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (iVar1 != 8) break;
  }
  if (bVar2) {
    __return_storage_ptr__->m_type = Null;
    Variant::SetBoolean(__return_storage_ptr__,value);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AllAreFinished(ScriptPtr script, const Parameters & params)
	{
		auto collPtr = params[0].GetCollection();
		bool allFinished = true;
		for (const auto & pair : *collPtr)
		{
			if (!pair.second.IsCoroutine())
			{
				ScriptIPtr s = std::static_pointer_cast<Script>(script);
				s->Error("Invalid parameters to 'all (of) {} (are) finished' function");
				return false;
			}
			if (!pair.second.GetCoroutine()->IsFinished())
				allFinished = false;
		}
		return allFinished;
	}